

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

void __thiscall Win32MakefileGenerator::processVars(Win32MakefileGenerator *this)

{
  ProString *pPVar1;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  QArrayDataPointer<ProString> *pQVar10;
  QArrayDataPointer<ProString> *pQVar11;
  ProStringList *pPVar12;
  ProStringList *pPVar13;
  QList<ProString> *pQVar14;
  pointer pQVar15;
  iterator this_00;
  iterator iVar16;
  QMakeProject *pQVar17;
  char *pcVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  ProStringList ret;
  QStringBuilder<QLatin1String,_QString_&> local_e0;
  ProKey local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
  QMakeEvaluator::first(&local_68,&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
  bVar7 = ProString::endsWith(&local_68,"aux",CaseSensitive);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar7) goto LAB_00257375;
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"TARGET");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_ORIG_TARGET");
  pQVar11 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
  QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_c8,"PRL_TARGET");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,&local_c8);
  QArrayDataPointer<ProString>::operator=(pQVar10,pQVar11);
  if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_PROJECT_NAME");
  bVar7 = QMakeProject::isEmpty(pQVar17,(ProKey *)&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar7) {
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_ORIG_TARGET");
    pQVar10 = (QArrayDataPointer<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar17 = (this->super_MakefileGenerator).project;
    pcVar18 = "QMAKE_PROJECT_NAME";
LAB_00256247:
    ProKey::ProKey((ProKey *)&local_98,pcVar18);
    pQVar11 = (QArrayDataPointer<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
    QMakeEvaluator::first(&local_68,&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    bVar7 = ProString::startsWith(&local_68,"vc",CaseSensitive);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7) {
      pQVar17 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_PROJECT_NAME");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
      pQVar17 = (this->super_MakefileGenerator).project;
      pcVar18 = "MAKEFILE";
      goto LAB_00256247;
    }
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR_POST");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_INCDIR");
  pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
  pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
             pPVar1 + (pPVar12->super_QList<ProString>).d.size);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIBDIR_POST");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_LIBDIR");
  pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
  pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
             pPVar1 + (pPVar12->super_QList<ProString>).d.size);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar2 = (pPVar12->super_QList<ProString>).d.size;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar2 != 0) {
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"INCLUDEPATH");
    pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
               pPVar1 + (pPVar12->super_QList<ProString>).d.size);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"VERSION");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar2 = (pPVar12->super_QList<ProString>).d.size;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar2 != 0) {
    local_c8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"VERSION");
    QMakeEvaluator::first(&local_68,&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    ProString::toQString((QString *)&local_e0,&local_68);
    QString::split(&local_c8,&local_e0,0x2e,0,1);
    if ((QArrayData *)local_e0.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e0.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e0.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e0.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e0.a.m_size,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((undefined1 *)local_c8.super_ProString.m_string.d.size != (undefined1 *)0x0) {
      pQVar17 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"VER_MAJ");
      pQVar14 = &QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68)->
                 super_QList<ProString>;
      pQVar15 = QList<QString>::data((QList<QString> *)&local_c8);
      ProString::ProString(&local_98,pQVar15);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,&local_98);
      QList<ProString>::end(pQVar14);
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((undefined1 *)0x1 < (ulong)local_c8.super_ProString.m_string.d.size) {
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"VER_MIN");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68)->
                   super_QList<ProString>;
        pQVar15 = QList<QString>::data((QList<QString> *)&local_c8);
        ProString::ProString(&local_98,pQVar15 + 1);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,&local_98);
        QList<ProString>::end(pQVar14);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_c8);
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  QVar19.m_data = (storage_type *)0x17;
  QVar19.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar19);
  pDVar3 = local_68.m_string.d.d;
  bVar7 = false;
  config.m_data = local_68.m_string.d.ptr;
  config.m_size = local_68.m_string.d.size;
  bVar8 = QMakeEvaluator::isActiveConfig(&pQVar17->super_QMakeEvaluator,config,false);
  if (!bVar8) {
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"TARGET_VERSION_EXT");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    if ((pPVar12->super_QList<ProString>).d.size == 0) {
      pQVar17 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
      pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
      bVar7 = (pPVar12->super_QList<ProString>).d.size != 0;
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      bVar7 = false;
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (bVar7) {
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"TARGET_VERSION_EXT");
    pQVar14 = &QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68)->
               super_QList<ProString>;
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_c8,"VER_MAJ");
    QMakeEvaluator::first(&local_98,&pQVar17->super_QMakeEvaluator,&local_c8);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,&local_98);
    QList<ProString>::end(pQVar14);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  fixTargetExt(this);
  processRcFileVar(this);
  local_c8.super_ProString.m_string.d.d = (Data *)0x0;
  local_c8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
  local_c8.super_ProString.m_string.d.size = 0;
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIBDIR");
  pQVar14 = &QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68)->
             super_QList<ProString>;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_00 = QList<ProString>::begin(pQVar14);
  iVar16 = QList<ProString>::end(pQVar14);
  if (this_00.i != iVar16.i) {
    do {
      local_98.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString(&local_98.m_string,this_00.i);
      if ((undefined1 *)local_98.m_string.d.size != (undefined1 *)0x0) {
        cVar9 = QString::endsWith((QChar)(char16_t)&local_98,0x5c);
        if (cVar9 != '\0') {
          QString::chop((longlong)&local_98);
        }
        local_e0.a.m_size = 2;
        local_e0.a.m_data = "-L";
        local_e0.b = &local_98.m_string;
        ProString::ProString<QLatin1String,QString&>(&local_68,&local_e0);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)&local_c8,local_c8.super_ProString.m_string.d.size
                   ,&local_68);
        QList<ProString>::end((QList<ProString> *)&local_c8);
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00.i = this_00.i + 1;
      iVar16 = QList<ProString>::end(pQVar14);
    } while (this_00.i != iVar16.i);
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"LIBS");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_98.m_string.d.d = local_c8.super_ProString.m_string.d.d;
  local_98.m_string.d.ptr = local_c8.super_ProString.m_string.d.ptr;
  local_98.m_string.d.size = local_c8.super_ProString.m_string.d.size;
  if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)&local_98,pPVar1,
             pPVar1 + (pPVar12->super_QList<ProString>).d.size);
  qVar5 = local_98.m_string.d.size;
  pcVar4 = local_98.m_string.d.ptr;
  pDVar3 = local_98.m_string.d.d;
  local_98.m_string.d.size = 0;
  local_98.m_string.d.d = (Data *)0x0;
  local_98.m_string.d.ptr = (storage_type_conflict *)0x0;
  local_68.m_string.d.d = (Data *)(pPVar12->super_QList<ProString>).d.d;
  local_68.m_string.d.ptr = (char16_t *)(pPVar12->super_QList<ProString>).d.ptr;
  (pPVar12->super_QList<ProString>).d.d = (Data *)pDVar3;
  (pPVar12->super_QList<ProString>).d.ptr = (ProString *)pcVar4;
  local_68.m_string.d.size = (pPVar12->super_QList<ProString>).d.size;
  (pPVar12->super_QList<ProString>).d.size = qVar5;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_68);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_98);
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"TEMPLATE");
  pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
  bVar7 = ProStringList::contains(pPVar12,"app",CaseSensitive);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  if (bVar7) {
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_CFLAGS_APP");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_CFLAGS");
    pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
               pPVar1 + (pPVar12->super_QList<ProString>).d.size);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_CXXFLAGS_APP");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_CXXFLAGS");
    pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
               pPVar1 + (pPVar12->super_QList<ProString>).d.size);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar17 = (this->super_MakefileGenerator).project;
    pcVar18 = "QMAKE_LFLAGS_APP";
LAB_00256de2:
    ProKey::ProKey((ProKey *)&local_68,pcVar18);
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_LFLAGS");
    pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
    pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
               pPVar1 + (pPVar12->super_QList<ProString>).d.size);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    ProKey::ProKey((ProKey *)&local_68,"TEMPLATE");
    pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
    bVar7 = ProStringList::contains(pPVar12,"lib",CaseSensitive);
    if (bVar7) {
      pQVar17 = (this->super_MakefileGenerator).project;
      QVar20.m_data = (storage_type *)0x3;
      QVar20.m_size = (qsizetype)&local_98;
      QString::fromUtf8(QVar20);
      pDVar3 = local_98.m_string.d.d;
      config_00.m_data = local_98.m_string.d.ptr;
      config_00.m_size = local_98.m_string.d.size;
      bVar7 = QMakeEvaluator::isActiveConfig(&pQVar17->super_QMakeEvaluator,config_00,false);
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      bVar7 = false;
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7 != false) {
      pQVar17 = (this->super_MakefileGenerator).project;
      QVar21.m_data = (storage_type *)0x6;
      QVar21.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar21);
      pDVar3 = local_68.m_string.d.d;
      config_01.m_data = local_68.m_string.d.ptr;
      config_01.m_size = local_68.m_string.d.size;
      bVar8 = QMakeEvaluator::isActiveConfig(&pQVar17->super_QMakeEvaluator,config_01,false);
      bVar7 = true;
      if (bVar8) {
        pQVar17 = (this->super_MakefileGenerator).project;
        QVar22.m_data = (storage_type *)0x1c;
        QVar22.m_size = (qsizetype)&local_68;
        QString::fromUtf8(QVar22);
        pDVar6 = local_68.m_string.d.d;
        config_02.m_data = local_68.m_string.d.ptr;
        config_02.m_size = local_68.m_string.d.size;
        bVar7 = QMakeEvaluator::isActiveConfig(&pQVar17->super_QMakeEvaluator,config_02,false);
        bVar7 = !bVar7;
        if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
      }
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      if (bVar7) {
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CFLAGS_SHLIB");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CFLAGS");
        pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
        pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
                   pPVar1 + (pPVar12->super_QList<ProString>).d.size);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CXXFLAGS_SHLIB");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CXXFLAGS");
        pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
        pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
                   pPVar1 + (pPVar12->super_QList<ProString>).d.size);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      pQVar17 = (this->super_MakefileGenerator).project;
      QVar23.m_data = (storage_type *)0x6;
      QVar23.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar23);
      pDVar3 = local_68.m_string.d.d;
      config_03.m_data = local_68.m_string.d.ptr;
      config_03.m_size = local_68.m_string.d.size;
      bVar7 = QMakeEvaluator::isActiveConfig(&pQVar17->super_QMakeEvaluator,config_03,false);
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      pQVar17 = (this->super_MakefileGenerator).project;
      if (bVar7) {
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CFLAGS_PLUGIN");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CFLAGS");
        pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
        pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
                   pPVar1 + (pPVar12->super_QList<ProString>).d.size);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CXXFLAGS_PLUGIN");
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_68);
        pQVar17 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CXXFLAGS");
        pPVar13 = QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)&local_98);
        pPVar1 = (pPVar12->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar13,pPVar1,
                   pPVar1 + (pPVar12->super_QList<ProString>).d.size);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar17 = (this->super_MakefileGenerator).project;
        pcVar18 = "QMAKE_LFLAGS_PLUGIN";
      }
      else {
        pcVar18 = "QMAKE_LFLAGS_SHLIB";
      }
      goto LAB_00256de2;
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_c8);
LAB_00257375:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::processVars()
{
    if (project->first("TEMPLATE").endsWith("aux"))
        return;

    project->values("PRL_TARGET") =
            project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");
    if (project->isEmpty("QMAKE_PROJECT_NAME"))
        project->values("QMAKE_PROJECT_NAME") = project->values("QMAKE_ORIG_TARGET");
    else if (project->first("TEMPLATE").startsWith("vc"))
        project->values("MAKEFILE") = project->values("QMAKE_PROJECT_NAME");

    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_LIBDIR") += project->values("QMAKE_LIBDIR_POST");

    if (!project->values("QMAKE_INCDIR").isEmpty())
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");

    if (!project->values("VERSION").isEmpty()) {
        QStringList l = project->first("VERSION").toQString().split('.');
        if (l.size() > 0)
            project->values("VER_MAJ").append(l[0]);
        if (l.size() > 1)
            project->values("VER_MIN").append(l[1]);
    }

    // TARGET_VERSION_EXT will be used to add a version number onto the target name
    if (!project->isActiveConfig("skip_target_version_ext")
        && project->values("TARGET_VERSION_EXT").isEmpty()
        && !project->values("VER_MAJ").isEmpty())
        project->values("TARGET_VERSION_EXT").append(project->first("VER_MAJ"));

    fixTargetExt();
    processRcFileVar();

    ProStringList libs;
    ProStringList &libDir = project->values("QMAKE_LIBDIR");
    for (ProStringList::Iterator libDir_it = libDir.begin(); libDir_it != libDir.end(); ++libDir_it) {
        QString lib = (*libDir_it).toQString();
        if (!lib.isEmpty()) {
            if (lib.endsWith('\\'))
                lib.chop(1);
            libs << QLatin1String("-L") + lib;
        }
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = libs + qmklibs;

    if (project->values("TEMPLATE").contains("app")) {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->values("TEMPLATE").contains("lib") && project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
        }
    }
}